

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O1

uint8_t * __thiscall
MPEGPictureHeader::deserialize(MPEGPictureHeader *this,uint8_t *buf,int64_t buf_size)

{
  BitStreamReader *this_00;
  uint *puVar1;
  bool bVar2;
  uint8_t uVar3;
  uint uVar4;
  PictureCodingType PVar5;
  uint8_t *puVar6;
  
  this_00 = &this->bitReader;
  BitStream::setBuffer(&this_00->super_BitStream,buf,buf + buf_size);
  (this->bitReader).m_bitLeft = 0;
  uVar4 = BitStreamReader::getCurVal(this_00,(this->bitReader).super_BitStream.m_buffer);
  (this->bitReader).m_curVal = uVar4;
  (this->bitReader).m_bitLeft = 0x20;
  uVar4 = BitStreamReader::getBits(this_00,10);
  *(short *)&(this->super_MPEGRawDataHeader).field_0x1c = (short)uVar4;
  PVar5 = BitStreamReader::getBits(this_00,3);
  this->pict_type = PVar5;
  if ((PVar5 & ~D_FRAME) == FORBIDDEN) {
    puVar6 = (uint8_t *)0x0;
  }
  else {
    uVar4 = BitStreamReader::getBits(this_00,0x10);
    this->vbv_delay = (uint16_t)uVar4;
    if ((this->pict_type & ~I_FRAME) == P_FRAME) {
      bVar2 = BitStreamReader::getBit(this_00);
      this->full_pel[0] = (uint)bVar2;
      uVar4 = BitStreamReader::getBits(this_00,3);
      uVar3 = (uint8_t)uVar4;
      this->f_code = uVar3;
      this->mpeg_f_code[0][0] = uVar3;
      this->mpeg_f_code[0][1] = uVar3;
    }
    if (this->pict_type == B_FRAME) {
      bVar2 = BitStreamReader::getBit(this_00);
      this->full_pel[1] = (uint)bVar2;
      uVar4 = BitStreamReader::getBits(this_00,3);
      uVar3 = (uint8_t)uVar4;
      this->f_code = uVar3;
      this->mpeg_f_code[1][0] = uVar3;
      this->mpeg_f_code[1][1] = uVar3;
    }
    puVar1 = (this->bitReader).super_BitStream.m_initBuffer;
    puVar6 = (uint8_t *)
             ((long)((int)(((*(int *)&(this->bitReader).super_BitStream.m_buffer - (int)puVar1) * 8
                            - (this->bitReader).m_bitLeft | 7) + 0x21) >> 3) + (long)puVar1);
    this->m_headerSize = (int)puVar6 - (int)buf;
  }
  return puVar6;
}

Assistant:

uint8_t* MPEGPictureHeader::deserialize(uint8_t* buf, const int64_t buf_size)
{
    bitReader.setBuffer(buf, buf + buf_size);

    ref = bitReader.getBits<int16_t>(10); /* temporal ref */
    pict_type = static_cast<PictureCodingType>(bitReader.getBits(3));
    if (pict_type == PictureCodingType::FORBIDDEN || pict_type == PictureCodingType::D_FRAME)
        return nullptr;

    vbv_delay = bitReader.getBits<int16_t>(16);

    if (pict_type == PictureCodingType::P_FRAME || pict_type == PictureCodingType::B_FRAME)
    {
        full_pel[0] = bitReader.getBit();
        f_code = bitReader.getBits<uint8_t>(3);
        mpeg_f_code[0][0] = f_code;
        mpeg_f_code[0][1] = f_code;
    }
    if (pict_type == PictureCodingType::B_FRAME)
    {
        full_pel[1] = bitReader.getBit();
        f_code = bitReader.getBits<uint8_t>(3);
        mpeg_f_code[1][0] = f_code;
        mpeg_f_code[1][1] = f_code;
    }
    uint8_t* new_buff = skipProcessedBytes(bitReader);
    m_headerSize = static_cast<int>(new_buff - buf);
    return new_buff;
}